

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O1

void __thiscall libtorrent::aux::packet_buffer::reserve(packet_buffer *this,uint32_t size)

{
  _Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  _Var1;
  __uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true> _Var2;
  tuple<libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter> __ptr_00;
  uint uVar3;
  _Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  _Var4;
  uint32_t uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  pointer *__ptr;
  uint uVar11;
  unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
  new_storage;
  _Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  local_28;
  
  uVar8 = 0x10;
  if (this->m_capacity != 0) {
    uVar8 = (ulong)this->m_capacity;
  }
  do {
    uVar6 = uVar8;
    uVar3 = (uint)uVar6;
    uVar8 = (ulong)(uVar3 * 2);
  } while (uVar3 < size);
  puVar7 = (ulong *)operator_new__(uVar6 * 8 + 8);
  *puVar7 = uVar6;
  local_28.
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
        )(puVar7 + 1);
  if (uVar3 != 0) {
    lVar9 = 0;
    do {
      *(undefined8 *)
       ((long)&((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
               local_28.
               super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
               ._M_head_impl)->_M_t + lVar9) = 0;
      lVar9 = lVar9 + 8;
    } while (uVar6 << 3 != lVar9);
  }
  uVar5 = this->m_capacity;
  uVar11 = this->m_first;
  if (uVar11 < uVar5 + uVar11) {
    do {
      uVar8 = (ulong)(uVar5 - 1 & uVar11);
      _Var1.
      super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ._M_head_impl =
           (this->m_storage).
           super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           ._M_t.
           super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           .
           super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ;
      uVar10 = uVar11 & uVar3 - 1;
      _Var2.super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
      super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl =
           *(__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
            ((long)_Var1.
                   super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                   ._M_head_impl + uVar8 * 8);
      *(undefined8 *)
       ((long)_Var1.
              super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
              ._M_head_impl + uVar8 * 8) = 0;
      __ptr_00.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
      super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter> *)
            &(((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
              ((long)local_28.
                     super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                     ._M_head_impl + (ulong)uVar10 * 8))->_M_t).
             super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>;
      (((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
       ((long)local_28.
              super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
              ._M_head_impl + (ulong)uVar10 * 8))->_M_t).
      super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> =
           _Var2.super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
           _M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
           super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
      if (__ptr_00.
          super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
          super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl !=
          (_Head_base<0UL,_libtorrent::aux::packet_*,_false>)0x0) {
        free((void *)__ptr_00.
                     super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>
                     .super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl);
      }
      uVar11 = uVar11 + 1;
      uVar5 = this->m_capacity;
    } while (uVar11 < this->m_first + uVar5);
  }
  _Var4.
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       local_28.
       super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
       ._M_head_impl;
  local_28.
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
        )(unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0;
  _Var1.
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       (this->m_storage).
       super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
       ._M_t.
       super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
       .
       super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ;
  (this->m_storage).
  super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
       = _Var4.
         super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         ._M_head_impl;
  if (_Var1.
      super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ._M_head_impl != (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0)
  {
    ::std::
    default_delete<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>[]>::
    operator()((default_delete<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>[]>
                *)this,(unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
                       _Var1.
                       super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                       ._M_head_impl);
  }
  this->m_capacity = uVar3;
  if (local_28.
      super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ._M_head_impl != (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0)
  {
    ::std::
    default_delete<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>[]>::
    operator()((default_delete<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>[]>
                *)&local_28,
               (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
               local_28.
               super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
               ._M_head_impl);
  }
  return;
}

Assistant:

void packet_buffer::reserve(std::uint32_t size)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT_VAL(size <= 0xffff, size);
		std::uint32_t new_size = m_capacity == 0 ? 16 : m_capacity;

		while (new_size < size)
			new_size <<= 1;

		aux::unique_ptr<packet_ptr[], index_type> new_storage(new packet_ptr[new_size]);

		for (index_type i = m_first; i < (m_first + m_capacity); ++i)
			new_storage[i & (new_size - 1)] = std::move(m_storage[i & (m_capacity - 1)]);

		m_storage = std::move(new_storage);
		m_capacity = new_size;
	}